

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O0

void __thiscall Arena_ConNoDecon_Test::TestBody(Arena_ConNoDecon_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  pair<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,_0UL>_*,_(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,_0UL>_*>
  pVar3;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_90;
  Message local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  Arena arena;
  Arena_ConNoDecon_Test *this_local;
  
  arena._blocks._block._previous = (Block *)this;
  memt::Arena::Arena((Arena *)local_30);
  pVar3 = memt::Arena::
          allocArray<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>>
                    ((Arena *)local_30,3);
  memt::Arena::freeTop((Arena *)local_30,pVar3.first);
  (anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::
  resetLog_abi_cxx11_();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
            ((EqHelper *)local_60,"ConNoDeconHelper::resetLog()","\"+1+2+3\"",&local_80,
             (char (*) [7])"+1+2+3");
  std::__cxx11::string::~string((string *)&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  if (gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_a9 = memt::Arena::isEmpty((Arena *)local_30);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_a8,&local_a9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e0,(internal *)local_a8,(AssertionResult *)"arena.isEmpty()","false","true",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xca,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      testing::Message::~Message(&local_b8);
    }
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  memt::Arena::~Arena((Arena *)local_30);
  return;
}

Assistant:

TEST(Arena, ConNoDecon) {
  memt::Arena arena;
  arena.freeTop(arena.allocArray<ConNoDeconHelper>(3).first);
  ASSERT_EQ(ConNoDeconHelper::resetLog(), "+1+2+3");
  ASSERT_TRUE(arena.isEmpty());
}